

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void assign_rnd_level(d_level *dest,d_level *src,int range)

{
  char cVar1;
  xchar xVar2;
  int iVar3;
  char local_24;
  int range_local;
  d_level *src_local;
  d_level *dest_local;
  
  dest->dnum = src->dnum;
  cVar1 = src->dlevel;
  if (range < 1) {
    iVar3 = rnd(-range);
    local_24 = -(char)iVar3;
  }
  else {
    iVar3 = rnd(range);
    local_24 = (char)iVar3;
  }
  dest->dlevel = cVar1 + local_24;
  cVar1 = dest->dlevel;
  xVar2 = dunlevs_in_dungeon(dest);
  if (xVar2 < cVar1) {
    xVar2 = dunlevs_in_dungeon(dest);
    dest->dlevel = xVar2;
  }
  else if (dest->dlevel < '\x01') {
    dest->dlevel = '\x01';
  }
  return;
}

Assistant:

void assign_rnd_level(d_level *dest, const d_level *src, int range)
{
	dest->dnum = src->dnum;
	dest->dlevel = src->dlevel + ((range > 0) ? rnd(range) : -rnd(-range)) ;

	if (dest->dlevel > dunlevs_in_dungeon(dest))
		dest->dlevel = dunlevs_in_dungeon(dest);
	else if (dest->dlevel < 1)
		dest->dlevel = 1;
}